

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadStringFallback
          (CodedInputStream *this,string *buffer,int size)

{
  uint8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if (buffer->_M_string_length != 0) {
    buffer->_M_string_length = 0;
    *(buffer->_M_dataplus)._M_p = '\0';
  }
  iVar3 = this->current_limit_;
  if (this->total_bytes_limit_ < this->current_limit_) {
    iVar3 = this->total_bytes_limit_;
  }
  if ((((iVar3 != 0x7fffffff) &&
       (iVar3 = (iVar3 - this->total_bytes_read_) + this->buffer_size_after_limit_ +
                (*(int *)&this->buffer_end_ - *(int *)&this->buffer_), size <= iVar3)) && (0 < size)
      ) && (0 < iVar3)) {
    std::__cxx11::string::reserve((ulong)buffer);
  }
  do {
    iVar3 = size;
    puVar1 = this->buffer_;
    iVar4 = (int)this->buffer_end_ - (int)puVar1;
    if (iVar3 - iVar4 == 0 || iVar3 < iVar4) {
      std::__cxx11::string::append((char *)buffer,(ulong)puVar1);
      this->buffer_ = this->buffer_ + iVar3;
      break;
    }
    if (iVar4 != 0) {
      std::__cxx11::string::append((char *)buffer,(ulong)puVar1);
    }
    this->buffer_ = this->buffer_ + iVar4;
    bVar2 = Refresh(this);
    size = iVar3 - iVar4;
  } while (bVar2);
  return iVar3 <= iVar4;
}

Assistant:

bool CodedInputStream::ReadStringFallback(std::string* buffer, int size) {
  if (!buffer->empty()) {
    buffer->clear();
  }

  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  if (closest_limit != INT_MAX) {
    int bytes_to_limit = closest_limit - CurrentPosition();
    if (bytes_to_limit > 0 && size > 0 && size <= bytes_to_limit) {
      buffer->reserve(size);
    }
  }

  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Some STL implementations "helpfully" crash on buffer->append(NULL, 0).
    if (current_buffer_size != 0) {
      // Note:  string1.append(string2) is O(string2.size()) (as opposed to
      //   O(string1.size() + string2.size()), which would be bad).
      buffer->append(reinterpret_cast<const char*>(buffer_),
                     current_buffer_size);
    }
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  buffer->append(reinterpret_cast<const char*>(buffer_), size);
  Advance(size);

  return true;
}